

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Value * json_object_dotget_value(JSON_Object *object,char *name)

{
  char *pcVar1;
  JSON_Value *pJVar2;
  
  while( true ) {
    pcVar1 = strchr(name,0x2e);
    if (pcVar1 == (char *)0x0) break;
    pJVar2 = json_object_getn_value(object,name,(long)pcVar1 - (long)name);
    if ((pJVar2 == (JSON_Value *)0x0) || (pJVar2->type != 4)) {
      object = (JSON_Object *)0x0;
    }
    else {
      object = (pJVar2->value).object;
    }
    name = pcVar1 + 1;
  }
  pJVar2 = json_object_get_value(object,name);
  return pJVar2;
}

Assistant:

JSON_Value * json_object_dotget_value(const JSON_Object *object, const char *name) {
    const char *dot_position = strchr(name, '.');
    if (!dot_position) {
        return json_object_get_value(object, name);
    }
    object = json_value_get_object(json_object_getn_value(object, name, dot_position - name));
    return json_object_dotget_value(object, dot_position + 1);
}